

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_server_connection.c
# Opt level: O3

apx_error_t
apx_socketServerConnection_vtransmit_direct_message
          (void *arg,uint8_t *msg_data,int32_t msg_size,int32_t *bytes_available)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  apx_error_t aVar4;
  void *__dest;
  long lVar5;
  uint8_t header [4];
  undefined1 local_3c [4];
  int *local_38;
  
  if (arg == (void *)0x0) {
    aVar4 = 1;
  }
  else {
    aVar4 = 0x21;
    if (msg_size <= *(int *)((long)arg + 0x5c8)) {
      local_38 = bytes_available;
      uVar2 = numheader_encode32(local_3c,4,msg_size);
      lVar1 = (long)arg + 0x5b0;
      iVar3 = adt_bytearray_length(lVar1);
      if ((uint)(iVar3 - *(int *)((long)arg + 0x5cc)) < msg_size + uVar2) {
        connection_send_packet((apx_socketServerConnection_t *)arg);
        if (*(int *)((long)arg + 0x5cc) != 0) {
          __assert_fail("self->pending_bytes == 0u",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/extension/socket_server_connection.c"
                        ,0x18e,
                        "apx_error_t connection_transmit_direct_message(apx_socketServerConnection_t *, const uint8_t *, int32_t, int32_t *)"
                       );
        }
      }
      __dest = (void *)adt_bytearray_data(lVar1);
      memcpy(__dest,local_3c,(ulong)uVar2);
      *(int *)((long)arg + 0x5cc) = *(int *)((long)arg + 0x5cc) + uVar2;
      lVar5 = adt_bytearray_data(lVar1);
      memcpy((void *)((ulong)*(uint *)((long)arg + 0x5cc) + lVar5),msg_data,(long)msg_size);
      *(int *)((long)arg + 0x5cc) = *(int *)((long)arg + 0x5cc) + msg_size;
      iVar3 = adt_bytearray_length(lVar1);
      *local_38 = iVar3 - *(int *)((long)arg + 0x5cc);
      aVar4 = 0;
    }
  }
  return aVar4;
}

Assistant:

static apx_error_t connection_transmit_direct_message(apx_socketServerConnection_t* self, uint8_t const* msg_data, int32_t msg_size, int32_t* bytes_available)
{
   if (self != NULL)
   {
      uint8_t  header[NUMHEADER32_LONG_SIZE];
      if (msg_size > ((int32_t)self->default_buffer_size))
      {
         return APX_MSG_TOO_LARGE_ERROR;
      }
      apx_size_t const header_size = numheader_encode32(header, sizeof(header), msg_size);
      apx_size_t const bytes_to_send = header_size + msg_size;
      apx_size_t const buffer_available = ((apx_size_t)adt_bytearray_length(&self->send_buffer)) - self->pending_bytes;
      if (bytes_to_send > buffer_available)
      {
         connection_send_packet(self);
         assert(self->pending_bytes == 0u);
      }
      memcpy(adt_bytearray_data(&self->send_buffer), header, header_size);
      self->pending_bytes += header_size;
      memcpy(adt_bytearray_data(&self->send_buffer) + self->pending_bytes, msg_data, msg_size);
      self->pending_bytes += msg_size;
      *bytes_available = (int32_t)(((apx_size_t)adt_bytearray_length(&self->send_buffer)) - self->pending_bytes);
      return APX_NO_ERROR;
   }
   return APX_INVALID_ARGUMENT_ERROR;
}